

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

size_t GetParallelCPUCount(void)

{
  uint uVar1;
  unsigned_long *puVar2;
  unsigned_long local_30 [4];
  SystemInformation local_10;
  SystemInformation info;
  
  if (GetParallelCPUCount::count == 0) {
    cmsys::SystemInformation::SystemInformation(&local_10);
    cmsys::SystemInformation::RunCPUCheck(&local_10);
    uVar1 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_10);
    GetParallelCPUCount::count = (size_t)uVar1;
    local_30[1] = 1;
    puVar2 = std::max<unsigned_long>(&GetParallelCPUCount::count,local_30 + 1);
    GetParallelCPUCount::count = *puVar2;
    local_30[0] = 0x40;
    puVar2 = std::min<unsigned_long>(&GetParallelCPUCount::count,local_30);
    GetParallelCPUCount::count = *puVar2;
    cmsys::SystemInformation::~SystemInformation(&local_10);
  }
  return GetParallelCPUCount::count;
}

Assistant:

static std::size_t GetParallelCPUCount()
{
  static std::size_t count = 0;
  // Detect only on the first call
  if (count == 0) {
    cmsys::SystemInformation info;
    info.RunCPUCheck();
    count = info.GetNumberOfPhysicalCPU();
    count = std::max<std::size_t>(count, 1);
    count = std::min<std::size_t>(count, cmQtAutoGen::ParallelMax);
  }
  return count;
}